

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestsList
               (ostream *stream,
               vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  reference ppTVar5;
  TestSuite *test_suite_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2_1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  string local_a8;
  allocator local_81;
  string local_80;
  TestSuite *local_60;
  TestSuite *test_suite;
  const_iterator __end2;
  const_iterator __begin2;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  int total_tests;
  string kTestsuites;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites_local;
  ostream *stream_local;
  
  kTestsuites.field_2._8_8_ = test_suites;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&total_tests,"testsuites",(allocator *)((long)&__range2 + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  std::operator<<(stream,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  poVar4 = std::operator<<(stream,"<");
  std::operator<<(poVar4,(string *)&total_tests);
  uVar1 = kTestsuites.field_2._8_8_;
  __range2._0_4_ = 0;
  __end2 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                     ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                      kTestsuites.field_2._8_8_);
  test_suite = (TestSuite *)
               std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
                         ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                          uVar1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                                *)&test_suite);
    if (!bVar2) break;
    ppTVar5 = __gnu_cxx::
              __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
              ::operator*(&__end2);
    local_60 = *ppTVar5;
    iVar3 = TestSuite::total_test_count(local_60);
    __range2._0_4_ = iVar3 + (int)__range2;
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++(&__end2);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"tests",&local_81);
  StreamableToString<int>(&local_a8,(int *)&__range2);
  OutputXmlAttribute(stream,(string *)&total_tests,&local_80,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"name",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"AllTests",(allocator *)((long)&__range2_1 + 7));
  OutputXmlAttribute(stream,(string *)&total_tests,&local_c8,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::operator<<(stream,">\n");
  uVar1 = kTestsuites.field_2._8_8_;
  __end2_1 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::begin
                       ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                        kTestsuites.field_2._8_8_);
  test_suite_1 = (TestSuite *)
                 std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::end
                           ((vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *)
                            uVar1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
                        *)&test_suite_1);
    if (!bVar2) break;
    ppTVar5 = __gnu_cxx::
              __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
              ::operator*(&__end2_1);
    PrintXmlTestSuite(stream,*ppTVar5);
    __gnu_cxx::
    __normal_iterator<testing::TestSuite_*const_*,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>
    ::operator++(&__end2_1);
  }
  poVar4 = std::operator<<(stream,"</");
  poVar4 = std::operator<<(poVar4,(string *)&total_tests);
  std::operator<<(poVar4,">\n");
  std::__cxx11::string::~string((string *)&total_tests);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestsList(
    std::ostream* stream, const std::vector<TestSuite*>& test_suites) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  int total_tests = 0;
  for (auto test_suite : test_suites) {
    total_tests += test_suite->total_test_count();
  }
  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(total_tests));
  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  for (auto test_suite : test_suites) {
    PrintXmlTestSuite(stream, *test_suite);
  }
  *stream << "</" << kTestsuites << ">\n";
}